

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_event.c
# Opt level: O2

char * ngx_event_use(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  long *plVar1;
  void *pvVar2;
  void ****ppppvVar3;
  ngx_module_t *pnVar4;
  char *__s1;
  ngx_uint_t nVar5;
  int iVar6;
  ngx_event_conf_t *ecf;
  ngx_module_t **ppnVar7;
  void *local_38;
  
  if (*(long *)((long)conf + 8) != -1) {
    return "is duplicate";
  }
  pvVar2 = cf->args->elts;
  ppppvVar3 = cf->cycle->old_cycle->conf_ctx;
  if (ppppvVar3 == (void ****)0x0) {
    local_38 = (void *)0x0;
  }
  else {
    local_38 = (*ppppvVar3[ngx_events_module.index])[ngx_event_core_module.ctx_index];
  }
  ppnVar7 = cf->cycle->modules;
  plVar1 = (long *)((long)pvVar2 + 0x10);
  do {
    pnVar4 = *ppnVar7;
    if (pnVar4 == (ngx_module_t *)0x0) {
      ngx_conf_log_error(1,cf,0,"invalid event type \"%V\"",plVar1);
      return (char *)0xffffffffffffffff;
    }
    if ((pnVar4->type == 0x544e5645) && (**pnVar4->ctx == *plVar1)) {
      __s1 = (char *)(*pnVar4->ctx)[1];
      iVar6 = strcmp(__s1,*(char **)((long)pvVar2 + 0x18));
      if (iVar6 == 0) {
        nVar5 = pnVar4->ctx_index;
        *(ngx_uint_t *)((long)conf + 8) = nVar5;
        *(char **)((long)conf + 0x28) = __s1;
        if (ngx_process != 0) {
          return (char *)0x0;
        }
        if (local_38 != (void *)0x0) {
          if (*(ngx_uint_t *)((long)local_38 + 8) != nVar5) {
            ngx_conf_log_error(1,cf,0,
                               "when the server runs without a master process the \"%V\" event type must be the same as in previous configuration - \"%s\" and it cannot be changed on the fly, to change it you need to stop server and start it again"
                               ,plVar1,*(undefined8 *)((long)local_38 + 0x28));
            return (char *)0xffffffffffffffff;
          }
          return (char *)0x0;
        }
        return (char *)0x0;
      }
    }
    ppnVar7 = ppnVar7 + 1;
  } while( true );
}

Assistant:

static char *
ngx_event_use(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_event_conf_t  *ecf = conf;

    ngx_int_t             m;
    ngx_str_t            *value;
    ngx_event_conf_t     *old_ecf;
    ngx_event_module_t   *module;

    if (ecf->use != NGX_CONF_UNSET_UINT) {
        return "is duplicate";
    }

    value = cf->args->elts;

    if (cf->cycle->old_cycle->conf_ctx) {
        old_ecf = ngx_event_get_conf(cf->cycle->old_cycle->conf_ctx,
                                     ngx_event_core_module);
    } else {
        old_ecf = NULL;
    }


    for (m = 0; cf->cycle->modules[m]; m++) {
        if (cf->cycle->modules[m]->type != NGX_EVENT_MODULE) {
            continue;
        }

        module = cf->cycle->modules[m]->ctx;
        if (module->name->len == value[1].len) {
            if (ngx_strcmp(module->name->data, value[1].data) == 0) {
                ecf->use = cf->cycle->modules[m]->ctx_index;
                ecf->name = module->name->data;

                if (ngx_process == NGX_PROCESS_SINGLE
                    && old_ecf
                    && old_ecf->use != ecf->use)
                {
                    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "when the server runs without a master process "
                               "the \"%V\" event type must be the same as "
                               "in previous configuration - \"%s\" "
                               "and it cannot be changed on the fly, "
                               "to change it you need to stop server "
                               "and start it again",
                               &value[1], old_ecf->name);

                    return NGX_CONF_ERROR;
                }

                return NGX_CONF_OK;
            }
        }
    }

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                       "invalid event type \"%V\"", &value[1]);

    return NGX_CONF_ERROR;
}